

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::prepareTopology(SimInfo *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  pointer pdVar1;
  pointer ppAVar2;
  pointer piVar3;
  _Base_ptr p_Var4;
  pointer ppAVar5;
  Molecule *pMVar6;
  pointer ppCVar7;
  Atom *pAVar8;
  CutoffGroup *this_02;
  RealType RVar9;
  double dVar10;
  int reg;
  MoleculeIterator local_50;
  int local_48;
  int local_44;
  _Base_ptr local_40;
  SimInfo *local_38;
  
  pdVar1 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_50._M_node = (_Base_ptr)&DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->massFactors_,(ulong)(uint)this->nAtoms_,(value_type_conflict2 *)&local_50);
  local_50._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_50._M_node == local_40) {
    pMVar6 = (Molecule *)0x0;
  }
  else {
    pMVar6 = (Molecule *)local_50._M_node[1]._M_parent;
  }
  while (pMVar6 != (Molecule *)0x0) {
    ppCVar7 = (pMVar6->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar7 !=
        (pMVar6->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00132336;
    this_02 = (CutoffGroup *)0x0;
    while (this_02 != (CutoffGroup *)0x0) {
      RVar9 = CutoffGroup::getMass(this_02);
      ppAVar5 = (this_02->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar2 = (this_02->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar5 == ppAVar2) {
        pAVar8 = (Atom *)0x0;
      }
      else {
        pAVar8 = *ppAVar5;
      }
      pdVar1 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (ppAVar5 = ppAVar5 + 1, pAVar8 != (Atom *)0x0) {
        dVar10 = 1.0;
        if ((RVar9 != 0.0) || (NAN(RVar9))) {
          dVar10 = (pAVar8->super_StuntDouble).mass_ / RVar9;
        }
        pdVar1[(pAVar8->super_StuntDouble).localIndex_] = dVar10;
        if (ppAVar5 == ppAVar2) {
          pAVar8 = (Atom *)0x0;
        }
        else {
          pAVar8 = *ppAVar5;
        }
      }
      ppCVar7 = ppCVar7 + 1;
      this_02 = (CutoffGroup *)0x0;
      if (ppCVar7 !=
          (pMVar6->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00132336:
        this_02 = *ppCVar7;
      }
    }
    pMVar6 = nextMolecule(this,&local_50);
  }
  this_00 = &this->identArray_;
  piVar3 = (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve(this_00,(ulong)(uint)this->nAtoms_);
  p_Var4 = local_40;
  this_01 = &this->regions_;
  piVar3 = (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar3) {
    (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve(this_01,(ulong)(uint)this->nAtoms_);
  local_50._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_50._M_node == p_Var4) {
    pMVar6 = (Molecule *)0x0;
  }
  else {
    pMVar6 = (Molecule *)local_50._M_node[1]._M_parent;
  }
  local_38 = this;
  while (pMVar6 != (Molecule *)0x0) {
    local_44 = pMVar6->molStamp_->region_;
    ppAVar5 = (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar5 !=
        (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_00132428;
    pAVar8 = (Atom *)0x0;
    while (this = local_38, pAVar8 != (Atom *)0x0) {
      local_48 = Atom::getIdent(pAVar8);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_48);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,&local_44);
      ppAVar5 = ppAVar5 + 1;
      pAVar8 = (Atom *)0x0;
      if (ppAVar5 !=
          (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00132428:
        pAVar8 = *ppAVar5;
      }
    }
    pMVar6 = nextMolecule(local_38,&local_50);
  }
  this->topologyDone_ = true;
  return;
}

Assistant:

void SimInfo::prepareTopology() {
    // calculate mass ratio of cutoff group
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;
    Molecule::AtomIterator ai;
    Atom* atom;
    RealType totalMass;

    /**
     * The mass factor is the relative mass of an atom to the total
     * mass of the cutoff group it belongs to.  By default, all atoms
     * are their own cutoff groups, and therefore have mass factors of
     * 1.  We need some special handling for massless atoms, which
     * will be treated as carrying the entire mass of the cutoff
     * group.
     */
    massFactors_.clear();
    massFactors_.resize(getNAtoms(), 1.0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        totalMass = cg->getMass();
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          // Check for massless groups - set mfact to 1 if true
          if (totalMass != 0)
            massFactors_[atom->getLocalIndex()] = atom->getMass() / totalMass;
          else
            massFactors_[atom->getLocalIndex()] = 1.0;
        }
      }
    }

    // Build the identArray_ and regions_

    identArray_.clear();
    identArray_.reserve(getNAtoms());
    regions_.clear();
    regions_.reserve(getNAtoms());

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      int reg = mol->getRegion();
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        identArray_.push_back(atom->getIdent());
        regions_.push_back(reg);
      }
    }

    topologyDone_ = true;
  }